

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spec.h
# Opt level: O2

void __thiscall bandit::reporter::spec::it_unknown_error(spec *this,string *desc)

{
  ostream *poVar1;
  string asStack_38 [32];
  
  progress_base::it_unknown_error((progress_base *)this,desc);
  poVar1 = (this->super_colored_base).stm_;
  (*((this->super_colored_base).colorizer_)->_vptr_interface[5])(asStack_38);
  std::operator<<(poVar1,asStack_38);
  std::__cxx11::string::~string(asStack_38);
  std::operator<<((this->super_colored_base).stm_,"ERROR");
  poVar1 = (this->super_colored_base).stm_;
  (*((this->super_colored_base).colorizer_)->_vptr_interface[7])(asStack_38);
  std::operator<<(poVar1,asStack_38);
  std::__cxx11::string::~string(asStack_38);
  std::endl<char,std::char_traits<char>>((this->super_colored_base).stm_);
  std::ostream::flush();
  return;
}

Assistant:

void it_unknown_error(const std::string& desc) override {
        progress_base::it_unknown_error(desc);
        stm_ << colorizer_.bad();
        stm_ << "ERROR";
        stm_ << colorizer_.reset();
        stm_ << std::endl;
        stm_.flush();
      }